

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

Type __thiscall wabt::LocalTypes::operator[](LocalTypes *this,Index i)

{
  pointer ppVar1;
  uint uVar2;
  
  ppVar1 = (this->decls_).
           super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = 0;
  while( true ) {
    if (ppVar1 == (this->decls_).
                  super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("i < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/ir.cc"
                    ,0xd1,"Type wabt::LocalTypes::operator[](Index) const");
    }
    uVar2 = uVar2 + ppVar1->second;
    if (i < uVar2) break;
    ppVar1 = ppVar1 + 1;
  }
  return ppVar1->first;
}

Assistant:

Type LocalTypes::operator[](Index i) const {
  Index count = 0;
  for (auto decl : decls_) {
    if (i < count + decl.second) {
      return decl.first;
    }
    count += decl.second;
  }
  assert(i < count);
  return Type::Any;
}